

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  _Bool _Var5;
  char *pcVar6;
  
  dest->version = source->version;
  dest->version_max = source->version_max;
  bVar2 = source->field_0x50 & 1;
  bVar1 = dest->field_0x50;
  dest->field_0x50 = bVar1 & 0xfe | bVar2;
  bVar3 = source->field_0x50 & 2;
  dest->field_0x50 = bVar1 & 0xfc | bVar2 | bVar3;
  bVar4 = source->field_0x50 & 4;
  dest->field_0x50 = bVar1 & 0xf8 | bVar2 | bVar3 | bVar4;
  dest->field_0x50 = bVar1 & 0xf0 | bVar2 | bVar3 | bVar4 | source->field_0x50 & 8;
  if (source->CApath == (char *)0x0) {
    dest->CApath = (char *)0x0;
LAB_0014e065:
    if (source->CAfile == (char *)0x0) {
      dest->CAfile = (char *)0x0;
    }
    else {
      pcVar6 = (*Curl_cstrdup)(source->CAfile);
      dest->CAfile = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0014e167;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
    }
    else {
      pcVar6 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0014e167;
    }
    if (source->random_file == (char *)0x0) {
      dest->random_file = (char *)0x0;
    }
    else {
      pcVar6 = (*Curl_cstrdup)(source->random_file);
      dest->random_file = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0014e167;
    }
    if (source->egdsocket == (char *)0x0) {
      dest->egdsocket = (char *)0x0;
    }
    else {
      pcVar6 = (*Curl_cstrdup)(source->egdsocket);
      dest->egdsocket = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0014e167;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar6 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0014e167;
    }
    if (source->cipher_list13 == (char *)0x0) {
      dest->cipher_list13 = (char *)0x0;
    }
    else {
      pcVar6 = (*Curl_cstrdup)(source->cipher_list13);
      dest->cipher_list13 = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0014e167;
    }
    if (source->pinned_key == (char *)0x0) {
      dest->pinned_key = (char *)0x0;
    }
    else {
      pcVar6 = (*Curl_cstrdup)(source->pinned_key);
      dest->pinned_key = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0014e167;
    }
    _Var5 = true;
  }
  else {
    pcVar6 = (*Curl_cstrdup)(source->CApath);
    dest->CApath = pcVar6;
    if (pcVar6 != (char *)0x0) goto LAB_0014e065;
LAB_0014e167:
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;

  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(clientcert);
  CLONE_STRING(random_file);
  CLONE_STRING(egdsocket);
  CLONE_STRING(cipher_list);
  CLONE_STRING(cipher_list13);
  CLONE_STRING(pinned_key);

  return TRUE;
}